

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausProcessClausesCut2(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *pSims [16];
  long local_98 [17];
  
  uVar8 = *(uint *)&pCut->field_0x4;
  if (0x5fffffff < uVar8 + 0xc0000000) {
    __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0xfe,
                  "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  iVar5 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar6 = iVar5 - iVar1;
  if ((uVar6 & 7) == 0) {
    uVar7 = 0;
    do {
      local_98[uVar7] =
           (long)&pSimMan[1].pAig + (long)pCut->pLeaves[uVar7] * (long)iVar5 * 4 + (long)iVar1 * 4;
      uVar7 = uVar7 + 1;
    } while (uVar8 >> 0x1d != uVar7);
    *(undefined1 (*) [16])(pScores + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pScores + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pScores + 4) = (undefined1  [16])0x0;
    pScores[0] = 0;
    pScores[1] = 0;
    pScores[2] = 0;
    pScores[3] = 0;
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        iVar5 = 0;
        do {
          if (*(uint *)&pCut->field_0x4 < 0x20000000) {
            lVar3 = 0;
          }
          else {
            uVar2 = 0;
            uVar8 = 0;
            do {
              uVar4 = 1 << ((byte)uVar2 & 0x1f);
              if ((*(uint *)(local_98[uVar2] + uVar7 * 4) & 1 << ((byte)iVar5 & 0x1f)) == 0) {
                uVar4 = 0;
              }
              uVar8 = uVar8 | uVar4;
              uVar2 = uVar2 + 1;
            } while (*(uint *)&pCut->field_0x4 >> 0x1d != uVar2);
            lVar3 = (long)(int)uVar8;
          }
          pScores[lVar3] = pScores[lVar3] + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0x20);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
    }
    return ~-(uint)(pScores[0xf] == 0) & 0x8000 | ~-(uint)(pScores[0xb] == 0) & 0x800 |
           ~-(uint)(pScores[7] == 0) & 0x80 | ~-(uint)(pScores[3] == 0) & 8 |
           ~-(uint)(pScores[0xd] == 0) & 0x2000 | ~-(uint)(pScores[9] == 0) & 0x200 |
           ~-(uint)(pScores[5] == 0) & 0x20 | ~-(uint)(pScores[1] == 0) & 2 |
           ~-(uint)(pScores[0xe] == 0) & 0x4000 | ~-(uint)(pScores[10] == 0) & 0x400 |
           ~-(uint)(pScores[6] == 0) & 0x40 | ~-(uint)(pScores[2] == 0) & 4 |
           ~-(uint)(pScores[0xc] == 0) & 0x1000 | ~-(uint)(pScores[8] == 0) & 0x100 |
           ~-(uint)(pScores[4] == 0) & 0x10 | ~-(uint)(*pScores == 0) & 1;
  }
  __assert_fail("nWordsForSim % 8 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                ,0xff,
                "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
}

Assistant:

int Fra_ClausProcessClausesCut2( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned * pSims[16], uWord;
    int iMint, i, k, b;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    for ( i = 0; i < nWordsForSim; i++ )
        for ( k = 0; k < 32; k++ )
        {
            iMint = 0;
            for ( b = 0; b < (int)pCut->nLeaves; b++ )
                if ( pSims[b][i] & (1 << k) )
                    iMint |= (1 << b);
            pScores[iMint]++;
        }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}